

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extdev.c
# Opt level: O0

int envy_bios_parse_extdev(envy_bios *bios)

{
  uint8_t uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  envy_bios_extdev *peVar7;
  envy_bios_extdev_entry *peVar8;
  int local_40;
  uint8_t local_3c [2];
  byte local_3a;
  uint8_t local_39;
  int j;
  uint8_t bytes [4];
  envy_bios_extdev_entry *entry;
  int i;
  int wantrlen;
  int wanthlen;
  int err;
  envy_bios_extdev *extdev;
  envy_bios *bios_local;
  
  peVar7 = &bios->extdev;
  if (peVar7->offset == 0) {
    bios_local._4_4_ = 0;
  }
  else {
    uVar2 = bios_u8(bios,(uint)peVar7->offset,&(bios->extdev).version);
    uVar3 = bios_u8(bios,peVar7->offset + 1,&(bios->extdev).hlen);
    uVar4 = bios_u8(bios,peVar7->offset + 2,&(bios->extdev).entriesnum);
    uVar5 = bios_u8(bios,peVar7->offset + 3,&(bios->extdev).rlen);
    wantrlen = uVar5 | uVar4 | uVar3 | uVar2;
    if (4 < (bios->extdev).hlen) {
      uVar2 = bios_u8(bios,peVar7->offset + 4,&(bios->extdev).unk04);
      wantrlen = uVar2 | wantrlen;
    }
    if (wantrlen == 0) {
      envy_bios_block(bios,(uint)peVar7->offset,
                      (uint)(bios->extdev).hlen +
                      (uint)(bios->extdev).rlen * (uint)(bios->extdev).entriesnum,"EXTDEV",-1);
      i = 4;
      uVar1 = (bios->extdev).version;
      if ((uVar1 == '0') || (uVar1 == '@')) {
        if (4 < (bios->extdev).hlen) {
          i = 5;
        }
        if ((uint)(bios->extdev).hlen < (uint)i) {
          fprintf(_stderr,"EXTDEV table header too short [%d < %d]\n",(ulong)(bios->extdev).hlen,
                  (ulong)(uint)i);
          bios_local._4_4_ = -0x16;
        }
        else if ((bios->extdev).rlen < 4) {
          fprintf(_stderr,"EXTDEV table record too short [%d < %d]\n",(ulong)(bios->extdev).rlen,4);
          bios_local._4_4_ = -0x16;
        }
        else {
          if ((uint)i < (uint)(bios->extdev).hlen) {
            fprintf(_stderr,"EXTDEV table header longer than expected [%d > %d]\n",
                    (ulong)(bios->extdev).hlen,(ulong)(uint)i);
          }
          if (4 < (bios->extdev).rlen) {
            fprintf(_stderr,"EXTDEV table record longer than expected [%d > %d]\n",
                    (ulong)(bios->extdev).rlen,4);
          }
          peVar8 = (envy_bios_extdev_entry *)calloc((ulong)(bios->extdev).entriesnum,8);
          (bios->extdev).entries = peVar8;
          if ((bios->extdev).entries == (envy_bios_extdev_entry *)0x0) {
            bios_local._4_4_ = -0xc;
          }
          else {
            for (entry._0_4_ = 0; (int)entry < (int)(uint)(bios->extdev).entriesnum;
                entry._0_4_ = (int)entry + 1) {
              _j = (bios->extdev).entries + (int)entry;
              _j->offset = peVar7->offset + (ushort)(bios->extdev).hlen +
                           (ushort)(bios->extdev).rlen * (short)(int)entry;
              for (local_40 = 0; local_40 < 4; local_40 = local_40 + 1) {
                iVar6 = bios_u8(bios,(uint)_j->offset + local_40,local_3c + local_40);
                if (iVar6 != 0 || wantrlen != 0) {
                  return -0xe;
                }
                wantrlen = 0;
              }
              _j->type = local_3c[0];
              _j->addr = local_3c[1];
              _j->bus = (byte)((int)(uint)local_3a >> 4) & 1;
              _j->unk02_0 = local_3a & 0xf;
              _j->unk02_5 = (uint8_t)((int)(uint)local_3a >> 5);
              _j->unk03 = local_39;
            }
            (bios->extdev).valid = '\x01';
            bios_local._4_4_ = 0;
          }
        }
      }
      else {
        fprintf(_stderr,"Unknown EXTDEV table version %d.%d\n",
                (ulong)(uint)((int)(uint)(bios->extdev).version >> 4),
                (ulong)((bios->extdev).version & 0xf));
        bios_local._4_4_ = -0x16;
      }
    }
    else {
      bios_local._4_4_ = -0xe;
    }
  }
  return bios_local._4_4_;
}

Assistant:

int envy_bios_parse_extdev (struct envy_bios *bios) {
	struct envy_bios_extdev *extdev = &bios->extdev;
	if (!extdev->offset)
		return 0;
	int err = 0;
	err |= bios_u8(bios, extdev->offset, &extdev->version);
	err |= bios_u8(bios, extdev->offset+1, &extdev->hlen);
	err |= bios_u8(bios, extdev->offset+2, &extdev->entriesnum);
	err |= bios_u8(bios, extdev->offset+3, &extdev->rlen);
	if (extdev->hlen >= 5)
		err |= bios_u8(bios, extdev->offset+4, &extdev->unk04);
	if (err)
		return -EFAULT;
	envy_bios_block(bios, extdev->offset, extdev->hlen + extdev->rlen * extdev->entriesnum, "EXTDEV", -1);
	int wanthlen = 4;
	int wantrlen = 4;
	switch (extdev->version) {
		case 0x30:
		case 0x40:
			break;
		default:
			ENVY_BIOS_ERR("Unknown EXTDEV table version %d.%d\n", extdev->version >> 4, extdev->version & 0xf);
			return -EINVAL;
	}
	if (extdev->hlen >= 5)
		wanthlen = 5;
	if (extdev->hlen < wanthlen) {
		ENVY_BIOS_ERR("EXTDEV table header too short [%d < %d]\n", extdev->hlen, wanthlen);
		return -EINVAL;
	}
	if (extdev->rlen < wantrlen) {
		ENVY_BIOS_ERR("EXTDEV table record too short [%d < %d]\n", extdev->rlen, wantrlen);
		return -EINVAL;
	}
	if (extdev->hlen > wanthlen) {
		ENVY_BIOS_WARN("EXTDEV table header longer than expected [%d > %d]\n", extdev->hlen, wanthlen);
	}
	if (extdev->rlen > wantrlen) {
		ENVY_BIOS_WARN("EXTDEV table record longer than expected [%d > %d]\n", extdev->rlen, wantrlen);
	}
	extdev->entries = calloc(extdev->entriesnum, sizeof *extdev->entries);
	if (!extdev->entries)
		return -ENOMEM;
	int i;
	for (i = 0; i < extdev->entriesnum; i++) {
		struct envy_bios_extdev_entry *entry = &extdev->entries[i];
		entry->offset = extdev->offset + extdev->hlen + extdev->rlen * i;
		uint8_t bytes[4];
		int j;
		for (j = 0; j < 4; j++) {
			err |= bios_u8(bios, entry->offset+j, &bytes[j]);
			if (err)
				return -EFAULT;
		}
		entry->type = bytes[0];
		entry->addr = bytes[1];
		entry->bus = bytes[2] >> 4 & 1;
		entry->unk02_0 = bytes[2] & 0xf;
		entry->unk02_5 = bytes[2] >> 5;
		entry->unk03 = bytes[3];
	}
	extdev->valid = 1;
	return 0;
}